

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O3

void sfts_write_comment(sfts_t *f,char *cmnt)

{
  undefined8 uVar1;
  char _msg [31];
  
  if (cmnt == (char *)0x0) {
    _p2sc_msg("sfts_write_comment",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1d4,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL comment");
  }
  else {
    ffpcom(f->fts,cmnt,&f->stat);
    if (f->stat == 0) {
      return;
    }
    if (f->name == (char *)0x0) {
      uVar1 = g_strdup("memory");
    }
    else {
      uVar1 = g_path_get_basename();
    }
    ffgerr(f->stat,_msg);
    _msg[0x1e] = '\0';
    _p2sc_msg("sfts_write_comment",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1d8,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              _msg,uVar1);
  }
  exit(1);
}

Assistant:

void sfts_write_comment(sfts_t *f, const char *cmnt) {
    if (!cmnt) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL comment");
        return;
    }
    fits_write_comment(f->fts, cmnt, &f->stat);
    CHK_FTS(f);
}